

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O2

int __thiscall P2PSocket::listen(P2PSocket *this,int __fd,int __n)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  int *piVar4;
  char *__rhs;
  undefined7 extraout_var;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  sockaddr *extraout_RDX_01;
  int iVar5;
  ulong uVar6;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar6 = (ulong)(uint)__fd;
  SocketResource::setNonBlockingMode(&this->m_socket);
  __addr = extraout_RDX;
  if (__fd < 1) {
    iVar5 = this->m_maxPeers;
    iVar2 = Peers::count(&this->m_peers);
    __fd = iVar5 - iVar2;
    __addr = extraout_RDX_00;
    if (__fd == 0 || iVar5 < iVar2) goto LAB_0010cea7;
  }
  iVar5 = __fd + 2;
  while (iVar5 = iVar5 + -1, iVar5 != 0) {
    iVar2 = Peers::accept(&this->m_peers,(int)uVar6,__addr,in_RCX);
    __addr = extraout_RDX_01;
    if ((char)iVar2 == '\0') {
      plVar3 = (long *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Accept failure ",&local_59);
      piVar4 = __errno_location();
      __rhs = strerror(*piVar4);
      std::operator+(&local_58,&local_38,__rhs);
      *plVar3 = (long)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        *(undefined4 *)(plVar3 + 2) = local_58.field_2._M_allocated_capacity._0_4_;
        *(undefined4 *)((long)plVar3 + 0x14) = local_58.field_2._M_allocated_capacity._4_4_;
        *(undefined4 *)(plVar3 + 3) = local_58.field_2._8_4_;
        *(undefined4 *)((long)plVar3 + 0x1c) = local_58.field_2._12_4_;
      }
      else {
        *plVar3 = (long)local_58._M_dataplus._M_p;
        plVar3[2] = CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             local_58.field_2._M_allocated_capacity._0_4_);
      }
      plVar3[1] = local_58._M_string_length;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity._0_4_ =
           local_58.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      __cxa_throw(plVar3,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
    }
  }
LAB_0010cea7:
  bVar1 = SocketResource::setBlockMode(&this->m_socket);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void P2PSocket::listen(int queue)
{
    m_socket.setNonBlockingMode();
    int remain = queue > 0 ? queue : m_maxPeers - m_peers.count();
    if (remain > 0) {
        for (int i = 0; i <= remain; ++i) {
            if (!m_peers.accept())
                throw P2PSocketException(std::string{"Accept failure "} + std::strerror(errno));
        }
    }
    m_socket.setBlockMode();
}